

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

void free_node(_node_t *n)

{
  ulong uVar1;
  
  if (n->num_children != 0) {
    uVar1 = 0;
    do {
      if (n->children[uVar1] != (_node_t *)0x0) {
        free_node(n->children[uVar1]);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < n->num_children);
  }
  if (n->children != (_node_s **)0x0) {
    free(n->children);
  }
  free(n);
  return;
}

Assistant:

void free_node(_node_t* n)
{
    unsigned int i;
    for (i = 0; i < n->num_children; i++)
    {
        if (n->children[i])
            free_node(n->children[i]);
    }

    if (n->children)
        free(n->children);

    free(n);
}